

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opal_code.cpp
# Opt level: O1

bool am_is_group_and_not_pretending(Am_Object *in_obj)

{
  bool bVar1;
  Am_Value *in_value;
  Am_Value v;
  Am_Value local_18;
  
  bVar1 = Am_Is_Group_Or_Map(in_obj);
  if (bVar1) {
    local_18.type = 0;
    local_18.value.wrapper_value = (Am_Wrapper *)0x0;
    in_value = Am_Object::Get(in_obj,0x84,1);
    Am_Value::operator=(&local_18,in_value);
    bVar1 = Am_Value::Valid(&local_18);
    Am_Value::~Am_Value(&local_18);
    if (!bVar1) {
      return true;
    }
  }
  return false;
}

Assistant:

bool
am_is_group_and_not_pretending(Am_Object in_obj)
{
  if (Am_Is_Group_Or_Map(in_obj)) {
    Am_Value v;
    v = in_obj.Peek(Am_PRETEND_TO_BE_LEAF);
    if (!v.Valid()) {
      return (true);
    }
  }
  return (false);
}